

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

int __thiscall
ExampleAppConsole::TextEditCallback(ExampleAppConsole *this,ImGuiInputTextCallbackData *data)

{
  ImVector<const_char_*> *this_00;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  char **ppcVar6;
  char *s2;
  uint bytes_count;
  ulong uVar7;
  int c;
  char *pcVar8;
  int i_1;
  int i_00;
  int iVar9;
  int i;
  int iVar10;
  ImVector<const_char_*> candidates;
  
  if (data->EventFlag != 0x80) {
    if (data->EventFlag != 0x40) {
      return 0;
    }
    pcVar8 = data->Buf;
    iVar9 = data->CursorPos;
    pcVar2 = pcVar8 + iVar9;
    uVar4 = 0;
    do {
      bytes_count = uVar4;
      s2 = pcVar2;
      if (s2 <= pcVar8) break;
      pcVar2 = s2 + -1;
      uVar4 = bytes_count + 1;
    } while ((0x3b < (ulong)(byte)s2[-1]) ||
            ((0x800100100000200U >> ((ulong)(byte)s2[-1] & 0x3f) & 1) == 0));
    candidates.Size = 0;
    candidates.Capacity = 0;
    candidates.Data = (char **)0x0;
    this_00 = &this->Commands;
    for (iVar10 = 0; iVar10 < this_00->Size; iVar10 = iVar10 + 1) {
      ppcVar6 = ImVector<const_char_*>::operator[](this_00,iVar10);
      iVar5 = Strnicmp(*ppcVar6,s2,bytes_count);
      if (iVar5 == 0) {
        ppcVar6 = ImVector<const_char_*>::operator[](this_00,iVar10);
        ImVector<const_char_*>::push_back(&candidates,ppcVar6);
      }
    }
    if (candidates.Size == 0) {
      AddLog(this,"No match for \"%.*s\"!\n",(ulong)bytes_count,s2);
    }
    else if (candidates.Size == 1) {
      ImGuiInputTextCallbackData::DeleteChars
                (data,(((int)pcVar8 + iVar9) - *(int *)&data->Buf) - bytes_count,bytes_count);
      iVar9 = data->CursorPos;
      ppcVar6 = ImVector<const_char_*>::operator[](&candidates,0);
      ImGuiInputTextCallbackData::InsertChars(data,iVar9,*ppcVar6,(char *)0x0);
      ImGuiInputTextCallbackData::InsertChars(data,data->CursorPos," ",(char *)0x0);
    }
    else {
      uVar3 = (long)(int)bytes_count;
      iVar10 = candidates.Size;
      do {
        uVar7 = uVar3;
        bVar1 = true;
        iVar5 = 0;
        i_00 = 0;
        while ((i_00 < iVar10 && (bVar1))) {
          if (i_00 == 0) {
            ppcVar6 = ImVector<const_char_*>::operator[](&candidates,0);
            iVar5 = toupper((int)(*ppcVar6)[uVar7]);
            bVar1 = true;
          }
          else {
            if (iVar5 != 0) {
              ppcVar6 = ImVector<const_char_*>::operator[](&candidates,i_00);
              iVar10 = toupper((int)(*ppcVar6)[uVar7]);
              bVar1 = true;
              if (iVar5 == iVar10) goto LAB_0013d78a;
            }
            bVar1 = false;
          }
LAB_0013d78a:
          i_00 = i_00 + 1;
          iVar10 = candidates.Size;
        }
        uVar3 = uVar7 + 1;
      } while (bVar1);
      if (0 < (long)uVar7) {
        ImGuiInputTextCallbackData::DeleteChars
                  (data,(((int)pcVar8 + iVar9) - *(int *)&data->Buf) - bytes_count,bytes_count);
        iVar9 = data->CursorPos;
        ppcVar6 = ImVector<const_char_*>::operator[](&candidates,0);
        pcVar8 = *ppcVar6;
        ppcVar6 = ImVector<const_char_*>::operator[](&candidates,0);
        ImGuiInputTextCallbackData::InsertChars(data,iVar9,pcVar8,*ppcVar6 + (uVar7 & 0xffffffff));
      }
      AddLog(this,"Possible matches:\n");
      for (iVar9 = 0; iVar9 < candidates.Size; iVar9 = iVar9 + 1) {
        ppcVar6 = ImVector<const_char_*>::operator[](&candidates,iVar9);
        AddLog(this,"- %s\n",*ppcVar6);
      }
    }
    ImVector<const_char_*>::~ImVector(&candidates);
    return 0;
  }
  iVar9 = this->HistoryPos;
  if (data->EventKey == 4) {
    if (iVar9 == -1) {
      return 0;
    }
    iVar10 = -1;
    if (iVar9 + 1 < (this->History).Size) {
      iVar10 = iVar9 + 1;
    }
LAB_0013d842:
    this->HistoryPos = iVar10;
    if (iVar9 == iVar10) {
      return 0;
    }
    if (iVar10 < 0) {
      pcVar8 = "";
      goto LAB_0013d868;
    }
  }
  else {
    if (data->EventKey != 3) {
      return 0;
    }
    if (iVar9 == -1) {
      iVar10 = (this->History).Size + -1;
      goto LAB_0013d842;
    }
    if (iVar9 < 1) {
      return 0;
    }
    iVar10 = iVar9 + -1;
    this->HistoryPos = iVar10;
  }
  ppcVar6 = ImVector<char_*>::operator[](&this->History,iVar10);
  pcVar8 = *ppcVar6;
LAB_0013d868:
  ImGuiInputTextCallbackData::DeleteChars(data,0,data->BufTextLen);
  ImGuiInputTextCallbackData::InsertChars(data,0,pcVar8,(char *)0x0);
  return 0;
}

Assistant:

int     TextEditCallback(ImGuiInputTextCallbackData* data)
    {
        //AddLog("cursor: %d, selection: %d-%d", data->CursorPos, data->SelectionStart, data->SelectionEnd);
        switch (data->EventFlag)
        {
        case ImGuiInputTextFlags_CallbackCompletion:
            {
                // Example of TEXT COMPLETION

                // Locate beginning of current word
                const char* word_end = data->Buf + data->CursorPos;
                const char* word_start = word_end;
                while (word_start > data->Buf)
                {
                    const char c = word_start[-1];
                    if (c == ' ' || c == '\t' || c == ',' || c == ';')
                        break;
                    word_start--;
                }

                // Build a list of candidates
                ImVector<const char*> candidates;
                for (int i = 0; i < Commands.Size; i++)
                    if (Strnicmp(Commands[i], word_start, (int)(word_end-word_start)) == 0)
                        candidates.push_back(Commands[i]);

                if (candidates.Size == 0)
                {
                    // No match
                    AddLog("No match for \"%.*s\"!\n", (int)(word_end-word_start), word_start);
                }
                else if (candidates.Size == 1)
                {
                    // Single match. Delete the beginning of the word and replace it entirely so we've got nice casing.
                    data->DeleteChars((int)(word_start-data->Buf), (int)(word_end-word_start));
                    data->InsertChars(data->CursorPos, candidates[0]);
                    data->InsertChars(data->CursorPos, " ");
                }
                else
                {
                    // Multiple matches. Complete as much as we can..
                    // So inputing "C"+Tab will complete to "CL" then display "CLEAR" and "CLASSIFY" as matches.
                    int match_len = (int)(word_end - word_start);
                    for (;;)
                    {
                        int c = 0;
                        bool all_candidates_matches = true;
                        for (int i = 0; i < candidates.Size && all_candidates_matches; i++)
                            if (i == 0)
                                c = toupper(candidates[i][match_len]);
                            else if (c == 0 || c != toupper(candidates[i][match_len]))
                                all_candidates_matches = false;
                        if (!all_candidates_matches)
                            break;
                        match_len++;
                    }

                    if (match_len > 0)
                    {
                        data->DeleteChars((int)(word_start - data->Buf), (int)(word_end-word_start));
                        data->InsertChars(data->CursorPos, candidates[0], candidates[0] + match_len);
                    }

                    // List matches
                    AddLog("Possible matches:\n");
                    for (int i = 0; i < candidates.Size; i++)
                        AddLog("- %s\n", candidates[i]);
                }

                break;
            }
        case ImGuiInputTextFlags_CallbackHistory:
            {
                // Example of HISTORY
                const int prev_history_pos = HistoryPos;
                if (data->EventKey == ImGuiKey_UpArrow)
                {
                    if (HistoryPos == -1)
                        HistoryPos = History.Size - 1;
                    else if (HistoryPos > 0)
                        HistoryPos--;
                }
                else if (data->EventKey == ImGuiKey_DownArrow)
                {
                    if (HistoryPos != -1)
                        if (++HistoryPos >= History.Size)
                            HistoryPos = -1;
                }

                // A better implementation would preserve the data on the current input line along with cursor position.
                if (prev_history_pos != HistoryPos)
                {
                    const char* history_str = (HistoryPos >= 0) ? History[HistoryPos] : "";
                    data->DeleteChars(0, data->BufTextLen);
                    data->InsertChars(0, history_str);
                }
            }
        }
        return 0;
    }